

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_list.c
# Opt level: O0

int32_t adt_u32List_length(adt_u32List_t *self)

{
  adt_u32List_elem_t *local_20;
  adt_u32List_elem_t *iter;
  int32_t result;
  adt_u32List_t *self_local;
  
  iter._4_4_ = 0;
  if (self != (adt_u32List_t *)0x0) {
    for (local_20 = self->pFirst; local_20 != (adt_u32List_elem_t *)0x0; local_20 = local_20->pNext)
    {
      iter._4_4_ = iter._4_4_ + 1;
    }
  }
  return iter._4_4_;
}

Assistant:

int32_t adt_u32List_length(const adt_u32List_t *self)
{
   int32_t result=0;
   if (self != 0)
   {
      adt_u32List_elem_t *iter = self->pFirst;
      while(iter != 0)
      {
         ++result;
         iter = iter->pNext;
      }
   }
   return result;
}